

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::find_array_with_map(void)

{
  bool bVar1;
  char *in_RCX;
  char *pcVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  int *other;
  double *other_00;
  char (*other_01) [7];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_c28;
  basic_variable<std::allocator<char>_> *local_c08;
  basic_variable<std::allocator<char>_> *local_b78;
  undefined4 local_b6c;
  iterator local_b68;
  iterator local_b50;
  difference_type local_b38 [2];
  basic_variable<std::allocator<char>_> local_b28;
  undefined1 local_af8 [8];
  iterator where_23;
  basic_variable<std::allocator<char>_> local_ac8;
  undefined1 local_a90 [8];
  iterator where_22;
  basic_variable<std::allocator<char>_> local_a58;
  undefined1 local_a28 [72];
  undefined1 local_9e0 [8];
  iterator where_21;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_978 [64];
  undefined1 local_938 [8];
  iterator where_20;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8d8 [8];
  iterator where_19;
  undefined1 local_8a8 [8];
  iterator where_18;
  undefined1 local_878 [8];
  iterator where_17;
  iterator local_858;
  iterator local_840;
  difference_type local_828 [2];
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7e8 [8];
  iterator where_16;
  iterator local_7c8;
  iterator local_7b0;
  difference_type local_798 [2];
  undefined1 local_788 [8];
  iterator where_15;
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_720 [8];
  iterator where_14;
  undefined1 local_6f0 [16];
  iterator where_13;
  iterator local_6c8;
  iterator local_6b0;
  difference_type local_698 [2];
  basic_variable<std::allocator<char>_> local_688;
  undefined1 local_650 [8];
  iterator where_12;
  iterator local_630;
  iterator local_618;
  difference_type local_600 [2];
  undefined1 local_5f0 [16];
  iterator where_11;
  basic_variable<std::allocator<char>_> local_5b8;
  undefined1 local_580 [8];
  iterator where_10;
  undefined1 local_54c [12];
  iterator where_9;
  iterator local_528;
  iterator local_510;
  difference_type local_4f8 [2];
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4b8 [8];
  iterator where_8;
  iterator local_498;
  iterator local_480;
  difference_type local_468;
  undefined1 local_45c [12];
  iterator where_7;
  basic_variable<std::allocator<char>_> local_428;
  undefined1 local_3f0 [8];
  iterator where_6;
  undefined1 local_3b9 [9];
  iterator where_5;
  iterator local_398;
  iterator local_380;
  difference_type local_368 [2];
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_328 [8];
  iterator where_4;
  iterator local_308;
  iterator local_2f0;
  difference_type local_2d8;
  undefined1 local_2c9 [9];
  iterator where_3;
  iterator local_2a8;
  iterator local_290;
  difference_type local_278 [2];
  basic_variable<std::allocator<char>_> local_268;
  undefined1 local_230 [8];
  iterator where_2;
  iterator local_210;
  iterator local_1f8;
  difference_type local_1e0;
  undefined1 local_1d4 [12];
  iterator where_1;
  undefined1 local_1a0 [8];
  iterator where;
  nullable local_174;
  basic_variable<std::allocator<char>_> *local_170;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_170 = &local_168;
  local_174 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_170,&local_174);
  local_170 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_170,true);
  local_170 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_170,2);
  local_170 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_170,3.0);
  local_170 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_170,"hydrogen");
  local_170 = &local_78;
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (local_170,(basic_map<std::allocator<char>> *)"bravo","helium",in_RCX);
  local_48._0_8_ = &local_168;
  local_48._8_8_ = 6;
  init._M_len = (size_type)in_RCX;
  init._M_array = (iterator)0x6;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_b78 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_b78 = local_b78 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_b78);
  } while (local_b78 != &local_168);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_1a0,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_38,&local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1a0,
                     (iterator *)
                     &where_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x877,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1a0);
  local_1d4._0_4_ = 0;
  trial::dynamic::value::find<std::allocator<char>,trial::dynamic::nullable>
            ((iterator *)(local_1d4 + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_1d4,(nullable *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_210,(iterator *)(local_1d4 + 4));
  local_1e0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1f8,&local_210);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x87c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x87c,"void value_find_suite::find_array_with_map()",&local_1e0,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_1d4 + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_268);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_230,(value *)local_38,&local_268,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_290,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2a8,(iterator *)local_230);
  local_278[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_290,&local_2a8);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar4 = (bool *)0x880;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x880,"void value_find_suite::find_array_with_map()",local_278,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_290);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_230);
  local_2c9[0] = '\x01';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_2c9 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_2c9,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2f0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_308,(iterator *)(local_2c9 + 1));
  local_2d8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2f0,&local_308);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x885;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x885,"void value_find_suite::find_array_with_map()",&local_2d8,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_2c9 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_358,true);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_328,(value *)local_38,&local_358,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_380,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_398,(iterator *)local_328);
  local_368[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_380,&local_398);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar4 = (bool *)0x889;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x889,"void value_find_suite::find_array_with_map()",local_368,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_380);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_328);
  local_3b9[0] = '\0';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_3b9 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_3b9,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_3b9 + 1),
                     (iterator *)
                     &where_6.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x88d,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_3b9 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_428,false);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_3f0,(value *)local_38,&local_428,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_3f0,
                     (iterator *)
                     &where_7.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x891,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3f0);
  local_45c._0_4_ = 2;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_45c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_45c,(int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_480,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_498,(iterator *)(local_45c + 4));
  local_468 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_480,&local_498);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x896;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x896,"void value_find_suite::find_array_with_map()",&local_468,
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_480);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_45c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_4e8,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_4b8,(value *)local_38,&local_4e8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_510,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_528,(iterator *)local_4b8);
  local_4f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_510,&local_528);
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  other = (int *)0x89a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x89a,"void value_find_suite::find_array_with_map()",local_4f8,
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_510);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_4b8);
  local_54c._0_4_ = 0x16;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_54c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_54c,other);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_54c + 4),
                     (iterator *)
                     &where_10.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x89e,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_54c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_5b8,0x16);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_580,(value *)local_38,&local_5b8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_580,
                     (iterator *)
                     &where_11.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8a2,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_580);
  local_5f0._0_8_ = 0x4008000000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_5f0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_5f0,(double *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_618,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_630,(iterator *)(local_5f0 + 8));
  local_600[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_618,&local_630);
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x8a7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8a7,"void value_find_suite::find_array_with_map()",local_600,
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_630);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_5f0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_688,3.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_650,(value *)local_38,&local_688,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6b0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_6c8,(iterator *)local_650);
  local_698[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_6b0,&local_6c8);
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  other_00 = (double *)0x8ab;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8ab,"void value_find_suite::find_array_with_map()",local_698,
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_650);
  local_6f0._0_8_ = 0x4040800000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_6f0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_6f0,other_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_6f0 + 8),
                     (iterator *)
                     &where_14.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8af,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_6f0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_758,33.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_720,(value *)local_38,&local_758,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_720,
                     (iterator *)
                     &where_15.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8b3,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_720);
  trial::dynamic::value::find<std::allocator<char>,char[9]>
            ((iterator *)local_788,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"hydrogen",(char (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7b0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_7c8,(iterator *)local_788);
  local_798[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_7b0,&local_7c8);
  where_16.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x8b8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8b8,"void value_find_suite::find_array_with_map()",local_798,
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_788);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_818,"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_7e8,(value *)local_38,&local_818,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_840,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_858,(iterator *)local_7e8);
  local_828[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_840,&local_858);
  where_17.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  other_01 = (char (*) [7])0x8bc;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8bc,"void value_find_suite::find_array_with_map()",local_828,
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_840);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7e8);
  trial::dynamic::value::find<std::allocator<char>,char[7]>
            ((iterator *)local_878,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"helium",other_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_878,
                     (iterator *)
                     &where_18.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8c0,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_878);
  trial::dynamic::value::find<std::allocator<char>,char[6]>
            ((iterator *)local_8a8,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"alpha",(char (*) [6])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_8a8,
                     (iterator *)
                     &where_19.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8c4,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_908,"alpha");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_8d8,(value *)local_38,&local_908,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_8d8,
                     (iterator *)
                     &where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8c8,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9a8,"hydrogen");
  local_978._0_8_ = &local_9a8;
  local_978._8_8_ = 1;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (basic_array<std::allocator<char>_> *)local_978._0_8_,init_00);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_938,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_978 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_978 + 0x10));
  local_c08 = (basic_variable<std::allocator<char>_> *)local_978;
  do {
    local_c08 = local_c08 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_c08);
  } while (local_c08 != &local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_938,
                     (iterator *)
                     &where_21.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8cd,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a58,"helium");
  local_a28._0_8_ = &local_a58;
  local_a28._8_8_ = 1;
  init_01._M_len = (size_type)pcVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a28 + 0x10),
             (basic_array<std::allocator<char>_> *)local_a28._0_8_,init_01);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_9e0,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_a28 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a28 + 0x10));
  local_c28 = (basic_variable<std::allocator<char>_> *)local_a28;
  do {
    local_c28 = local_c28 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_c28);
  } while (local_c28 != &local_a58);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_9e0,
                     (iterator *)
                     &where_22.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8d1,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_9e0);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_ac8,(basic_map<std::allocator<char>> *)"alpha","hydrogen",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_a90,(value *)local_38,&local_ac8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_a90,
                     (iterator *)
                     &where_23.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8d6,"void value_find_suite::find_array_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a90);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_b28,(basic_map<std::allocator<char>> *)"bravo","helium",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_af8,(value *)local_38,&local_b28,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_b68,(iterator *)local_af8);
  local_b38[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_b50,&local_b68);
  local_b6c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x8da,"void value_find_suite::find_array_with_map()",local_b38,&local_b6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_af8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void find_array_with_map()
{
    variable data = array::make({ null, true, 2, 3.0, "hydrogen", map::make("bravo", "helium") });
    {
        variable::iterator where = value::find(data, data);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - null
    {
        variable::iterator where = value::find(data, null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable::iterator where = value::find(data, variable());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // array - boolean
    {
        variable::iterator where = value::find(data, true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, variable(true));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, false);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(false));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - integer
    {
        variable::iterator where = value::find(data, 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, variable(2));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, 22);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(22));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - real
    {
        variable::iterator where = value::find(data, 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, variable(3.0));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, 33.0);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(33.0));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - string
    {
        variable::iterator where = value::find(data, "hydrogen");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, variable("hydrogen"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, "helium");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, "alpha");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable("alpha"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - array
    {
        variable::iterator where = value::find(data, array::make({"hydrogen"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, array::make({"helium"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - map
    {
        variable::iterator where = value::find(data, map::make("alpha", "hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, map::make("bravo", "helium"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
}